

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O0

void __thiscall Colony::update_phero_matrix(Colony *this,double *total_tour_distance)

{
  double dVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  pointer pNVar4;
  double *pdVar5;
  size_type sVar6;
  reference pvVar7;
  int iVar8;
  double *in_RSI;
  Graph *in_RDI;
  double dVar9;
  int j;
  double tour_distance;
  int i;
  vector<Node,_std::allocator<Node>_> *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffffa0;
  vector<Node,_std::allocator<Node>_> *tour;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<Node,_std::allocator<Node>_> *in_stack_ffffffffffffffc0;
  vector<Node,_std::allocator<Node>_> local_38;
  double local_20;
  int local_14;
  double *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; local_14 < in_RDI->num_car; local_14 = local_14 + 1) {
    local_20 = 0.0;
    tour = &local_38;
    std::vector<Node,_std::allocator<Node>_>::vector
              (in_stack_ffffffffffffffc0,
               (vector<Node,_std::allocator<Node>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    Graph::calc_tour_distance(in_RDI,tour,in_stack_ffffffffffffffa0);
    std::vector<Node,_std::allocator<Node>_>::~vector(in_stack_ffffffffffffff80);
    *local_10 = local_20 + *local_10;
    in_stack_ffffffffffffffb8 = 0;
    while( true ) {
      in_stack_ffffffffffffffa0 = (double *)(long)in_stack_ffffffffffffffb8;
      pdVar5 = (double *)
               std::vector<Node,_std::allocator<Node>_>::size(&in_RDI->cars[local_14].tour);
      if (pdVar5 <= in_stack_ffffffffffffffa0) break;
      iVar8 = in_stack_ffffffffffffffb8 + 1;
      sVar6 = std::vector<Node,_std::allocator<Node>_>::size(&in_RDI->cars[local_14].tour);
      if ((long)iVar8 != sVar6) {
        pp_Var2 = in_RDI[1]._vptr_Graph;
        pvVar7 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (&in_RDI->cars[local_14].tour,(long)in_stack_ffffffffffffffb8);
        p_Var3 = pp_Var2[pvVar7->idx];
        pvVar7 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (&in_RDI->cars[local_14].tour,(long)(in_stack_ffffffffffffffb8 + 1));
        dVar1 = *(double *)(p_Var3 + (long)pvVar7->idx * 8);
        dVar9 = 1.0 / local_20;
        in_stack_ffffffffffffff80 = (vector<Node,_std::allocator<Node>_> *)in_RDI[1]._vptr_Graph;
        pvVar7 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (&in_RDI->cars[local_14].tour,(long)in_stack_ffffffffffffffb8);
        pNVar4 = (&(in_stack_ffffffffffffff80->super__Vector_base<Node,_std::allocator<Node>_>).
                   _M_impl.super__Vector_impl_data._M_start)[pvVar7->idx];
        pvVar7 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (&in_RDI->cars[local_14].tour,(long)(in_stack_ffffffffffffffb8 + 1));
        *(double *)(&pNVar4->x + (long)pvVar7->idx * 2) = dVar1 * 0.9 + dVar9;
      }
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1;
    }
  }
  return;
}

Assistant:

void Colony::update_phero_matrix(double &total_tour_distance)
{
	for (int i = 0; i < num_car; i++){
		double tour_distance = 0.0;
		calc_tour_distance(cars[i].tour, tour_distance);
		total_tour_distance += tour_distance;
		for (int j = 0; j < cars[i].tour.size(); j++){
			if(j+1 != cars[i].tour.size()){
				phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] = evap_rate * phero_matrix[cars[i].tour[j].idx][cars[i].tour[j+1].idx] + q / tour_distance;
			} 
		}
	}
}